

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::(anonymous_namespace)::YieldPromiseNode>::dispose
          (Own<kj::(anonymous_namespace)::YieldPromiseNode> *this)

{
  YieldPromiseNode *object;
  YieldPromiseNode *ptrCopy;
  Own<kj::(anonymous_namespace)::YieldPromiseNode> *this_local;
  
  object = this->ptr;
  if (object != (YieldPromiseNode *)0x0) {
    this->ptr = (YieldPromiseNode *)0x0;
    Disposer::dispose<kj::(anonymous_namespace)::YieldPromiseNode>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }